

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_block_scalar_breaks
              (yaml_parser_t *parser,int *indent,yaml_string_t *breaks,yaml_mark_t start_mark,
              yaml_mark_t *end_mark)

{
  yaml_char_t yVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  bool bVar4;
  int local_50;
  int local_4c;
  int local_48;
  int local_34;
  int max_indent;
  yaml_mark_t *end_mark_local;
  yaml_string_t *breaks_local;
  int *indent_local;
  yaml_parser_t *parser_local;
  
  local_34 = 0;
  end_mark->index = (parser->mark).index;
  end_mark->line = (parser->mark).line;
  end_mark->column = (parser->mark).column;
  while( true ) {
    if ((parser->unread == 0) && (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 == 0)) {
      return 0;
    }
    while( true ) {
      if ((*indent == 0) || (bVar4 = false, (int)(parser->mark).column < *indent)) {
        bVar4 = *(parser->buffer).pointer == ' ';
      }
      if (!bVar4) break;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_48 = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_4c = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_50 = 3;
          }
          else {
            local_50 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_50 = 4;
            }
          }
          local_4c = local_50;
        }
        local_48 = local_4c;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_48;
      if ((parser->unread == 0) && (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 == 0)) {
        return 0;
      }
    }
    if (local_34 < (int)(parser->mark).column) {
      local_34 = (int)(parser->mark).column;
    }
    if (((*indent == 0) || ((int)(parser->mark).column < *indent)) &&
       (*(parser->buffer).pointer == '\t')) {
      iVar3 = yaml_parser_set_scanner_error
                        (parser,"while scanning a block scalar",start_mark,
                         "found a tab character where an indentation space is expected");
      return iVar3;
    }
    if (((((*(parser->buffer).pointer != '\r') && (*(parser->buffer).pointer != '\n')) &&
         ((*(parser->buffer).pointer != 0xc2 || ((parser->buffer).pointer[1] != 0x85)))) &&
        (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
         ((parser->buffer).pointer[2] != 0xa8)))) &&
       (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
        ((parser->buffer).pointer[2] != 0xa9)))) {
      if (*indent == 0) {
        *indent = local_34;
        if (*indent < parser->indent + 1) {
          *indent = parser->indent + 1;
        }
        if (*indent < 1) {
          *indent = 1;
        }
      }
      return 1;
    }
    if ((parser->unread < 2) && (iVar3 = yaml_parser_update_buffer(parser,2), iVar3 == 0)) {
      return 0;
    }
    if ((breaks->end <= breaks->pointer + 5) &&
       (iVar3 = yaml_string_extend(&breaks->start,&breaks->pointer,&breaks->end), iVar3 == 0))
    break;
    if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = '\n';
      (parser->buffer).pointer = (parser->buffer).pointer + 2;
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 2;
    }
    else if ((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) {
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = '\n';
      (parser->buffer).pointer = (parser->buffer).pointer + 1;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 1;
    }
    else if ((*(parser->buffer).pointer == 0xc2) && ((parser->buffer).pointer[1] == 0x85)) {
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = '\n';
      (parser->buffer).pointer = (parser->buffer).pointer + 2;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 1;
    }
    else if (((*(parser->buffer).pointer == 0xe2) && ((parser->buffer).pointer[1] == 0x80)) &&
            (((parser->buffer).pointer[2] == 0xa8 || ((parser->buffer).pointer[2] == 0xa9)))) {
      pyVar2 = (parser->buffer).pointer;
      (parser->buffer).pointer = pyVar2 + 1;
      yVar1 = *pyVar2;
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar2 = (parser->buffer).pointer;
      (parser->buffer).pointer = pyVar2 + 1;
      yVar1 = *pyVar2;
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar2 = (parser->buffer).pointer;
      (parser->buffer).pointer = pyVar2 + 1;
      yVar1 = *pyVar2;
      pyVar2 = breaks->pointer;
      breaks->pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 1;
    }
    end_mark->index = (parser->mark).index;
    end_mark->line = (parser->mark).line;
    end_mark->column = (parser->mark).column;
  }
  parser->error = YAML_MEMORY_ERROR;
  return 0;
}

Assistant:

static int
yaml_parser_scan_block_scalar_breaks(yaml_parser_t *parser,
        int *indent, yaml_string_t *breaks,
        yaml_mark_t start_mark, yaml_mark_t *end_mark)
{
    int max_indent = 0;

    *end_mark = parser->mark;

    /* Eat the indentation spaces and line breaks. */

    while (1)
    {
        /* Eat the indentation spaces. */

        if (!CACHE(parser, 1)) return 0;

        while ((!*indent || (int)parser->mark.column < *indent)
                && IS_SPACE(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) return 0;
        }

        if ((int)parser->mark.column > max_indent)
            max_indent = (int)parser->mark.column;

        /* Check for a tab character messing the indentation. */

        if ((!*indent || (int)parser->mark.column < *indent)
                && IS_TAB(parser->buffer)) {
            return yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                    start_mark, "found a tab character where an indentation space is expected");
        }

        /* Have we found a non-empty line? */

        if (!IS_BREAK(parser->buffer)) break;

        /* Consume the line break. */

        if (!CACHE(parser, 2)) return 0;
        if (!READ_LINE(parser, *breaks)) return 0;
        *end_mark = parser->mark;
    }

    /* Determine the indentation level if needed. */

    if (!*indent) {
        *indent = max_indent;
        if (*indent < parser->indent + 1)
            *indent = parser->indent + 1;
        if (*indent < 1)
            *indent = 1;
    }

   return 1;
}